

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fast-dtoa.cc
# Opt level: O2

void TestFastDtoaGayShortestSingle(void)

{
  uint uVar1;
  char *expected_source;
  bool bVar2;
  PrecomputedShortestSingle *pPVar3;
  char *in_RCX;
  ulong uVar4;
  int *length_00;
  Vector<const_double_conversion::PrecomputedShortestSingle> VVar5;
  Vector<char> buffer;
  int *in_stack_ffffffffffffff38;
  int local_c0;
  int length;
  undefined8 local_b8;
  int point;
  ulong local_a8;
  ulong local_a0;
  char buffer_container [100];
  int *value_source;
  
  VVar5 = double_conversion::PrecomputedShortestSingleRepresentations();
  pPVar3 = VVar5.start_;
  uVar4 = 0;
  local_a8 = VVar5._8_8_ & 0xffffffff;
  if (VVar5.length_ < 1) {
    local_a8 = uVar4;
  }
  local_a0 = local_a8 * 0x18;
  local_b8 = 0;
  local_c0 = 0;
  for (; bVar2 = SUB81(in_RCX,0), local_a0 != uVar4; uVar4 = uVar4 + 0x18) {
    expected_source = *(char **)((long)&pPVar3->representation + uVar4);
    uVar1 = *(uint *)((long)&pPVar3->decimal_point + uVar4);
    in_RCX = (char *)0x64;
    value_source = &length;
    length_00 = &point;
    buffer._8_8_ = value_source;
    buffer.start_ = (char *)0x64;
    bVar2 = double_conversion::FastDtoa
                      ((double_conversion *)0x1,(double)*(float *)((long)&pPVar3->v + uVar4),
                       FAST_DTOA_SHORTEST,(int)buffer_container,buffer,length_00,
                       in_stack_ffffffffffffff38);
    CheckHelper((char *)0x15c,0xc19f34,(char *)(ulong)(length < 10),SUB81(in_RCX,0));
    if (bVar2) {
      local_b8 = CONCAT71((int7)((ulong)local_b8 >> 8),(byte)local_b8 | length == 9);
      local_c0 = local_c0 + 1;
      CheckEqualsHelper((char *)0x160,0xc0d26e,(char *)(ulong)uVar1,point,(char *)value_source,
                        (int)length_00);
      in_RCX = buffer_container;
      CheckEqualsHelper((char *)0x161,0xc0d289,expected_source,buffer_container,(char *)value_source
                        ,(char *)length_00);
    }
  }
  CheckHelper((char *)0x163,0xc19f5b,
              (char *)(ulong)(0.98 < (double)local_c0 / (double)(int)local_a8),bVar2);
  CheckHelper((char *)0x164,0xc19f22,(char *)(ulong)((byte)local_b8 & 1),bVar2);
  return;
}

Assistant:

TEST(FastDtoaGayShortestSingle) {
  char buffer_container[kBufferSize];
  Vector<char> buffer(buffer_container, kBufferSize);
  bool status;
  int length;
  int point;
  int succeeded = 0;
  int total = 0;
  bool needed_max_length = false;

  Vector<const PrecomputedShortestSingle> precomputed =
      PrecomputedShortestSingleRepresentations();
  for (int i = 0; i < precomputed.length(); ++i) {
    const PrecomputedShortestSingle current_test = precomputed[i];
    total++;
    float v = current_test.v;
    status = FastDtoa(v, FAST_DTOA_SHORTEST_SINGLE, 0, buffer, &length, &point);
    CHECK(kFastDtoaMaximalSingleLength >= length);
    if (!status) continue;
    if (length == kFastDtoaMaximalSingleLength) needed_max_length = true;
    succeeded++;
    CHECK_EQ(current_test.decimal_point, point);
    CHECK_EQ(current_test.representation, buffer.start());
  }
  CHECK(succeeded*1.0/total > 0.98);
  CHECK(needed_max_length);
}